

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstack.h
# Opt level: O1

uchar * __thiscall
CVmRun::call_func_ptr
          (CVmRun *this,vm_val_t *funcptr,uint argc,vm_rcdesc *recurse_ctx,uint caller_ofs)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  vm_datatype_t *pvVar2;
  undefined4 uVar3;
  vm_val_t *pvVar4;
  uchar *puVar5;
  vm_datatype_t vVar6;
  vm_obj_id_t vVar7;
  
  pvVar4 = sp_;
  pvVar2 = &sp_->typ;
  sp_ = sp_ + 5;
  *pvVar2 = VM_PROP;
  (pvVar4->val).prop = 0;
  vVar6 = VM_NIL;
  pvVar4[1].typ = VM_NIL;
  pvVar4[2].typ = VM_NIL;
  vVar7 = 0;
  if (funcptr->typ == VM_OBJ) {
    vVar7 = (funcptr->val).obj;
    vVar6 = VM_OBJ;
  }
  pvVar4[3].typ = vVar6;
  pvVar4[3].val.obj = vVar7;
  uVar3 = *(undefined4 *)&funcptr->field_0x4;
  aVar1 = funcptr->val;
  pvVar4[4].typ = funcptr->typ;
  *(undefined4 *)&pvVar4[4].field_0x4 = uVar3;
  pvVar4[4].val = aVar1;
  puVar5 = call_func_ptr_fr(this,funcptr,argc,recurse_ctx,caller_ofs);
  return puVar5;
}

Assistant:

VM_REG_ACCESS vm_val_t *push(unsigned int n)
    {
        /* remember the current stack pointer, which is what we return */
        vm_val_t *ret = sp_;

        /* allocate the elements */
        sp_ += n;

        /* return the base of the allocated block */
        return ret;
    }